

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderCheckMark(ImDrawList *draw_list,ImVec2 pos,ImU32 col,float sz)

{
  ImDrawList *pIVar1;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  float local_38;
  float local_34;
  float by;
  float bx;
  float third;
  float local_24;
  float local_20;
  float thickness;
  float sz_local;
  ImU32 col_local;
  ImDrawList *draw_list_local;
  ImVec2 pos_local;
  
  local_20 = sz;
  thickness = (float)col;
  _sz_local = draw_list;
  draw_list_local = (ImDrawList *)pos;
  local_24 = ImMax<float>(sz / 5.0,1.0);
  local_20 = -local_24 * 0.5 + local_20;
  ImVec2::ImVec2((ImVec2 *)&bx,local_24 * 0.25,local_24 * 0.25);
  operator+=((ImVec2 *)&draw_list_local,(ImVec2 *)&bx);
  pIVar1 = _sz_local;
  by = local_20 / 3.0;
  local_34 = draw_list_local._0_4_ + by;
  local_38 = -by * 0.5 + draw_list_local._4_4_ + local_20;
  ImVec2::ImVec2(&local_40,local_34 - by,local_38 - by);
  ImDrawList::PathLineTo(pIVar1,&local_40);
  pIVar1 = _sz_local;
  ImVec2::ImVec2(&local_48,local_34,local_38);
  ImDrawList::PathLineTo(pIVar1,&local_48);
  pIVar1 = _sz_local;
  ImVec2::ImVec2(&local_50,by + by + local_34,-by + -by + local_38);
  ImDrawList::PathLineTo(pIVar1,&local_50);
  ImDrawList::PathStroke(_sz_local,(ImU32)thickness,0,local_24);
  return;
}

Assistant:

void ImGui::RenderCheckMark(ImDrawList* draw_list, ImVec2 pos, ImU32 col, float sz)
{
    float thickness = ImMax(sz / 5.0f, 1.0f);
    sz -= thickness * 0.5f;
    pos += ImVec2(thickness * 0.25f, thickness * 0.25f);

    float third = sz / 3.0f;
    float bx = pos.x + third;
    float by = pos.y + sz - third * 0.5f;
    draw_list->PathLineTo(ImVec2(bx - third, by - third));
    draw_list->PathLineTo(ImVec2(bx, by));
    draw_list->PathLineTo(ImVec2(bx + third * 2.0f, by - third * 2.0f));
    draw_list->PathStroke(col, 0, thickness);
}